

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_int clEnqueueNDRangeKernel
                 (cl_command_queue command_queue,cl_kernel kernel,cl_uint work_dim,
                 size_t *global_work_offset,size_t *global_work_size,size_t *local_work_size,
                 cl_uint num_events_in_wait_list,cl_event *event_wait_list,cl_event *event)

{
  time_point queuedTime_00;
  cl_api_clCreateSampler enqueueCounter_00;
  CLIntercept *this;
  bool bVar1;
  bool bVar2;
  cl_icd_dispatch *pcVar3;
  SConfig *pSVar4;
  undefined2 extraout_var;
  CLIntercept *pCVar5;
  undefined8 uVar6;
  cl_api_clCreateProgramWithBinary in_RCX;
  cl_uint in_EDX;
  undefined8 unaff_RBX;
  cl_kernel in_RSI;
  CLIntercept *in_RDI;
  cl_kernel in_R8;
  cl_command_queue in_R9;
  CLIntercept *unaff_R14;
  CLIntercept *unaff_retaddr;
  cl_uint in_stack_00000008;
  undefined4 in_stack_0000000c;
  CLIntercept *in_stack_00000010;
  CLIntercept *in_stack_00000018;
  cl_kernel in_stack_00000020;
  uint64_t in_stack_00000028;
  CLIntercept *in_stack_00000030;
  size_t *in_stack_00000040;
  cl_command_queue in_stack_000000d8;
  cl_kernel in_stack_000000e0;
  uint64_t in_stack_000000e8;
  CLIntercept *in_stack_000000f0;
  time_point toolEnd_1;
  time_point toolStart_1;
  size_t *in_stack_000002f8;
  cl_uint in_stack_00000304;
  cl_kernel in_stack_00000308;
  CLIntercept *in_stack_00000310;
  cl_int e;
  time_point toolEnd;
  time_point toolStart;
  bool dumpImagesAfterEnqueue;
  bool dumpBuffersAfterEnqueue;
  size_t *in_stack_000003f8;
  size_t *in_stack_00000400;
  cl_uint in_stack_0000040c;
  cl_kernel in_stack_00000410;
  cl_command_queue in_stack_00000418;
  time_point cpuEnd;
  time_point cpuStart;
  size_t *in_stack_00000430;
  bool isLocalEvent;
  string *in_stack_00000438;
  cl_event local_event;
  time_point queuedTime;
  string deviceTag;
  string hostTag;
  string argsString;
  bool dumpImagesBeforeEnqueue;
  bool dumpBuffersBeforeEnqueue;
  bool captureReplay;
  uint64_t enqueueCounter;
  cl_int retVal;
  CLIntercept *pIntercept;
  CLIntercept *in_stack_fffffffffffffa70;
  CLIntercept *in_stack_fffffffffffffa78;
  CLIntercept *in_stack_fffffffffffffa80;
  CObjectTracker *in_stack_fffffffffffffa88;
  uint64_t in_stack_fffffffffffffa90;
  CLIntercept *in_stack_fffffffffffffa98;
  allocator *paVar7;
  CLIntercept *in_stack_fffffffffffffaa0;
  size_t **in_stack_fffffffffffffaa8;
  size_t *in_stack_fffffffffffffab0;
  undefined8 in_stack_fffffffffffffab8;
  cl_uint work_dim_00;
  CLIntercept *in_stack_fffffffffffffac0;
  allocator *in_stack_fffffffffffffac8;
  CLIntercept *in_stack_fffffffffffffad0;
  CLIntercept *in_stack_fffffffffffffad8;
  undefined7 in_stack_fffffffffffffae0;
  undefined1 in_stack_fffffffffffffae7;
  cl_event *in_stack_fffffffffffffae8;
  undefined8 in_stack_fffffffffffffaf0;
  cl_uint numEvents;
  undefined7 in_stack_fffffffffffffaf8;
  undefined1 in_stack_fffffffffffffaff;
  undefined1 uVar8;
  CLIntercept *in_stack_fffffffffffffb00;
  undefined8 in_stack_fffffffffffffb08;
  undefined1 includeId;
  SConfig *in_stack_fffffffffffffb10;
  SConfig *in_stack_fffffffffffffb18;
  CLIntercept *in_stack_fffffffffffffb20;
  time_point in_stack_fffffffffffffb28;
  time_point in_stack_fffffffffffffb30;
  time_point in_stack_fffffffffffffb38;
  time_point in_stack_fffffffffffffb40;
  cl_command_queue in_stack_fffffffffffffb48;
  CLIntercept *in_stack_fffffffffffffb50;
  size_t *in_stack_fffffffffffffb60;
  cl_uint in_stack_fffffffffffffb68;
  SConfig *in_stack_fffffffffffffb70;
  SConfig *in_stack_fffffffffffffb78;
  CLIntercept *in_stack_fffffffffffffb80;
  undefined7 in_stack_fffffffffffffb88;
  SConfig *in_stack_fffffffffffffb90;
  SConfig *in_stack_fffffffffffffb98;
  SConfig *in_stack_fffffffffffffba0;
  undefined7 in_stack_fffffffffffffbb0;
  undefined1 in_stack_fffffffffffffbb7;
  SConfig *in_stack_fffffffffffffbc0;
  string *in_stack_fffffffffffffc18;
  CLIntercept *in_stack_fffffffffffffc20;
  undefined7 in_stack_fffffffffffffc28;
  undefined1 in_stack_fffffffffffffc2f;
  size_t *in_stack_fffffffffffffc30;
  undefined8 in_stack_fffffffffffffc38;
  cl_uint work_dim_01;
  CLIntercept *in_stack_fffffffffffffc40;
  undefined8 in_stack_fffffffffffffc80;
  cl_kernel kernel_00;
  cl_int cVar9;
  CLIntercept *in_stack_fffffffffffffc88;
  CLIntercept *in_stack_fffffffffffffc90;
  SConfig *in_stack_fffffffffffffc98;
  CLIntercept *in_stack_fffffffffffffca0;
  bool local_349;
  bool local_336;
  bool local_335;
  int local_334;
  undefined8 local_330;
  undefined8 local_328;
  allocator local_319;
  string local_318 [32];
  undefined8 local_2f8;
  undefined8 local_2f0;
  allocator local_2e1;
  string local_2e0 [32];
  undefined8 in_stack_fffffffffffffd58;
  allocator local_289;
  string local_288 [32];
  undefined8 local_268;
  cl_kernel local_260;
  allocator local_251;
  string local_250 [32];
  undefined8 local_230;
  cl_int local_224;
  cl_kernel local_220;
  undefined8 local_218;
  cl_kernel in_stack_fffffffffffffdf0;
  cl_command_queue in_stack_fffffffffffffdf8;
  CLIntercept *in_stack_fffffffffffffe00;
  allocator local_1d9;
  string local_1d8 [24];
  cl_kernel in_stack_fffffffffffffe40;
  undefined7 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4f;
  undefined8 in_stack_fffffffffffffe50;
  undefined2 uVar10;
  string *in_stack_fffffffffffffe58;
  CLIntercept *in_stack_fffffffffffffe60;
  cl_kernel in_stack_fffffffffffffe68;
  string *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  CLIntercept *in_stack_fffffffffffffe80;
  undefined8 local_178;
  undefined2 uStack_172;
  string *in_stack_fffffffffffffe90;
  string *psVar11;
  cl_command_queue in_stack_fffffffffffffe98;
  undefined1 local_158 [16];
  undefined1 local_148 [32];
  undefined1 local_128 [64];
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [35];
  bool local_9d;
  allocator local_89;
  string local_88 [38];
  bool local_62;
  bool local_61;
  cl_api_clCreateSampler local_60;
  cl_int local_54;
  CLIntercept *local_50;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined2 uVar12;
  
  includeId = (undefined1)((ulong)in_stack_fffffffffffffb08 >> 0x38);
  uVar10 = (undefined2)((ulong)in_stack_fffffffffffffe50 >> 0x30);
  numEvents = (cl_uint)((ulong)in_stack_fffffffffffffaf0 >> 0x20);
  cVar9 = (cl_int)((ulong)in_stack_fffffffffffffc80 >> 0x20);
  work_dim_01 = (cl_uint)((ulong)in_stack_fffffffffffffc38 >> 0x20);
  work_dim_00 = (cl_uint)((ulong)in_stack_fffffffffffffab8 >> 0x20);
  uVar12 = (undefined2)((ulong)unaff_RBX >> 0x30);
  local_50 = GetIntercept();
  if ((local_50 == (CLIntercept *)0x0) ||
     (pcVar3 = CLIntercept::dispatch(local_50),
     pcVar3->clEnqueueNDRangeKernel == (cl_api_clEnqueueNDRangeKernel)0x0)) {
    local_334 = 0;
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_334);
    local_54 = -0x24;
  }
  else {
    local_54 = 0;
    local_60 = (cl_api_clCreateSampler)
               CLIntercept::incrementEnqueueCounter(in_stack_fffffffffffffad8);
    pSVar4 = CLIntercept::config(local_50);
    local_335 = false;
    if ((pSVar4->CaptureReplay & 1U) != 0) {
      bVar1 = CLIntercept::checkCaptureReplayEnqueueLimits(local_50,(uint64_t)local_60);
      local_335 = false;
      if (bVar1) {
        bVar1 = CLIntercept::checkCaptureReplayForKernel
                          (in_stack_fffffffffffffa80,(cl_kernel)in_stack_fffffffffffffa78);
        local_335 = false;
        if (bVar1) {
          local_335 = CLIntercept::checkCaptureReplayKernelSkips
                                (in_stack_fffffffffffffc20,(cl_kernel)in_stack_fffffffffffffc18);
        }
      }
    }
    local_61 = local_335;
    if (local_335 != false) {
      CLIntercept::startCaptureReplay
                (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018._4_4_,
                 &in_stack_00000010->m_ProcessId,
                 (size_t *)CONCAT44(in_stack_0000000c,in_stack_00000008),in_stack_00000040);
    }
    pSVar4 = CLIntercept::config(local_50);
    local_336 = false;
    if ((pSVar4->DumpBuffersBeforeEnqueue & 1U) != 0) {
      bVar1 = CLIntercept::checkDumpBufferEnqueueLimits(local_50,(uint64_t)local_60);
      local_336 = false;
      if (bVar1) {
        local_336 = CLIntercept::checkDumpBuffersForKernel
                              (in_stack_fffffffffffffa80,(cl_kernel)in_stack_fffffffffffffa78);
      }
    }
    local_62 = local_336;
    if (((local_61 & 1U) != 0) || (local_336 != false)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_88,"Pre",&local_89);
      CLIntercept::dumpBuffersForKernel
                (unaff_retaddr,(string *)unaff_R14,SUB21((ushort)uVar12 >> 8,0),SUB21(uVar12,0),
                 CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),(cl_kernel)in_RDI,
                 (cl_command_queue)in_stack_00000010);
      std::__cxx11::string::~string(local_88);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
    }
    pSVar4 = CLIntercept::config(local_50);
    local_349 = false;
    if ((pSVar4->DumpImagesBeforeEnqueue & 1U) != 0) {
      bVar1 = CLIntercept::checkDumpImageEnqueueLimits(local_50,(uint64_t)local_60);
      local_349 = false;
      if (bVar1) {
        local_349 = CLIntercept::checkDumpImagesForKernel
                              (in_stack_fffffffffffffa80,(cl_kernel)in_stack_fffffffffffffa78);
      }
    }
    local_9d = local_349;
    if (((local_61 & 1U) != 0) || (local_349 != false)) {
      in_stack_fffffffffffffca0 = local_50;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,"Pre",&local_c1);
      CLIntercept::dumpImagesForKernel
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,SUB21((ushort)uVar10 >> 8,0),
                 SUB21(uVar10,0),CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
                 in_stack_fffffffffffffe40,(cl_command_queue)in_stack_fffffffffffffe70);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    }
    pSVar4 = CLIntercept::config(local_50);
    if ((pSVar4->InjectBuffers & 1U) != 0) {
      CLIntercept::injectBuffersForKernel
                (in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8);
    }
    pSVar4 = CLIntercept::config(local_50);
    if ((pSVar4->InjectImages & 1U) != 0) {
      CLIntercept::injectImagesForKernel
                ((CLIntercept *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0),(uint64_t)in_RCX,in_R8,
                 in_R9);
    }
    pSVar4 = CLIntercept::config(local_50);
    if ((((pSVar4->AubCapture & 1U) != 0) &&
        (bVar1 = CLIntercept::checkAubCaptureEnqueueLimits(local_50,(uint64_t)local_60), bVar1)) &&
       (bVar1 = CLIntercept::checkAubCaptureKernelSignature
                          (in_stack_00000310,in_stack_00000308,in_stack_00000304,in_stack_000002f8,
                           (size_t *)toolStart_1.__d.__r), bVar1)) {
      pCVar5 = in_RDI;
      CLIntercept::startAubCapture
                (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                 (uint64_t)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                 (cl_uint)((ulong)in_stack_fffffffffffffe60 >> 0x20),
                 (size_t *)in_stack_fffffffffffffe58,(size_t *)in_stack_fffffffffffffe90,
                 in_stack_fffffffffffffe98);
      in_stack_fffffffffffffa70 = in_RDI;
      in_RDI = pCVar5;
    }
    pSVar4 = CLIntercept::config(local_50);
    if ((pSVar4->NullEnqueue & 1U) == 0) {
      pSVar4 = CLIntercept::config(local_50);
      if ((pSVar4->NullLocalWorkSize & 1U) != 0) {
        in_R9 = (cl_command_queue)0x0;
      }
      CLIntercept::overrideNullLocalWorkSize
                (in_stack_fffffffffffffac0,work_dim_00,in_stack_fffffffffffffab0,
                 in_stack_fffffffffffffaa8);
      std::__cxx11::string::string(local_e8);
      in_stack_fffffffffffffc98 = CLIntercept::config(local_50);
      pCVar5 = in_RDI;
      if ((in_stack_fffffffffffffc98->CallLogging & 1U) != 0) {
        CLIntercept::getEnqueueNDRangeKernelArgsString
                  (in_stack_fffffffffffffc40,work_dim_01,in_stack_fffffffffffffc30,
                   (size_t *)CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28),
                   &in_stack_fffffffffffffc20->m_ProcessId,in_stack_fffffffffffffc18);
        getFormattedEventWaitList_abi_cxx11_
                  (in_stack_fffffffffffffa98,(cl_uint)(in_stack_fffffffffffffa90 >> 0x20),
                   (cl_event *)in_stack_fffffffffffffa88);
        std::__cxx11::string::operator+=(local_e8,(string *)(local_128 + 0x20));
        std::__cxx11::string::~string((string *)(local_128 + 0x20));
        pCVar5 = in_RDI;
      }
      in_stack_fffffffffffffc90 = (CLIntercept *)CLIntercept::config(local_50);
      this = local_50;
      enqueueCounter_00 = local_60;
      in_RDI = pCVar5;
      if (((in_stack_fffffffffffffc90->m_Mutex).super___mutex_base._M_mutex.__size[3] & 1U) != 0) {
        kernel_00 = in_RSI;
        in_stack_fffffffffffffa70 = (CLIntercept *)std::__cxx11::string::c_str();
        CLIntercept::callLoggingEnter
                  (this,"clEnqueueNDRangeKernel",(uint64_t)enqueueCounter_00,kernel_00,
                   "queue = %p, kernel = %p, %s",pCVar5,kernel_00);
        cVar9 = (cl_int)((ulong)kernel_00 >> 0x20);
        in_stack_fffffffffffffc88 = pCVar5;
      }
      pSVar4 = CLIntercept::config(local_50);
      if ((pSVar4->EventChecking & 1U) != 0) {
        CLIntercept::checkEventList
                  (in_stack_fffffffffffffb00,
                   (char *)CONCAT17(in_stack_fffffffffffffaff,in_stack_fffffffffffffaf8),numEvents,
                   in_stack_fffffffffffffae8,
                   (cl_event *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
      }
      std::__cxx11::string::string((string *)local_128);
      std::__cxx11::string::string((string *)local_148);
      pSVar4 = CLIntercept::config(local_50);
      if ((((pSVar4->ChromeCallLogging & 1U) != 0) ||
          ((pSVar4 = CLIntercept::config(local_50), (pSVar4->HostPerformanceTiming & 1U) != 0 &&
           (bVar1 = CLIntercept::checkHostPerformanceTimingEnqueueLimits
                              (local_50,(uint64_t)local_60), bVar1)))) ||
         (((pSVar4 = CLIntercept::config(local_50), (pSVar4->DevicePerformanceTiming & 1U) != 0 ||
           (((pSVar4 = CLIntercept::config(local_50), (pSVar4->ITTPerformanceTiming & 1U) != 0 ||
             (pSVar4 = CLIntercept::config(local_50), (pSVar4->ChromePerformanceTiming & 1U) != 0))
            || (pSVar4 = CLIntercept::config(local_50),
               (pSVar4->DevicePerfCounterEventBasedSampling & 1U) != 0)))) &&
          (bVar1 = CLIntercept::checkDevicePerformanceTimingEnqueueLimits
                             (local_50,(uint64_t)local_60), bVar1)))) {
        in_stack_fffffffffffffa78 = (CLIntercept *)local_148;
        in_stack_fffffffffffffa70 = (CLIntercept *)local_128;
        CLIntercept::getTimingTagsKernel
                  ((CLIntercept *)cpuEnd.__d.__r,in_stack_00000418,in_stack_00000410,
                   in_stack_0000040c,in_stack_00000400,in_stack_000003f8,in_stack_00000430,
                   in_stack_00000438,(string *)local_event);
      }
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffa70);
      local_158._0_8_ = 0;
      bVar1 = false;
      pSVar4 = CLIntercept::config(local_50);
      if (((((pSVar4->DevicePerformanceTiming & 1U) != 0) ||
           (pSVar4 = CLIntercept::config(local_50), (pSVar4->ITTPerformanceTiming & 1U) != 0)) ||
          (pSVar4 = CLIntercept::config(local_50), (pSVar4->ChromePerformanceTiming & 1U) != 0)) ||
         (pSVar4 = CLIntercept::config(local_50),
         (pSVar4->DevicePerfCounterEventBasedSampling & 1U) != 0)) {
        local_158._8_8_ = std::chrono::_V2::steady_clock::now();
        bVar1 = in_stack_00000018 == (CLIntercept *)0x0;
        if (bVar1) {
          in_stack_00000018 = (CLIntercept *)local_158;
        }
      }
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffa70);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffa70);
      pSVar4 = CLIntercept::config(local_50);
      if (((pSVar4->HostPerformanceTiming & 1U) != 0) ||
         (pSVar4 = CLIntercept::config(local_50), (pSVar4->ChromeCallLogging & 1U) != 0)) {
        in_stack_fffffffffffffe90 = (string *)std::chrono::_V2::steady_clock::now();
      }
      pSVar4 = CLIntercept::config(local_50);
      if ((pSVar4->Emulate_cl_intel_unified_shared_memory & 1U) != 0) {
        CLIntercept::setUSMKernelExecInfo
                  (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
      }
      local_54 = -0x3b;
      pSVar4 = CLIntercept::config(local_50);
      if ((pSVar4->OverrideBuiltinKernels & 1U) != 0) {
        in_stack_fffffffffffffa70 =
             (CLIntercept *)
             CONCAT44((int)((ulong)in_stack_fffffffffffffa70 >> 0x20),in_stack_00000008);
        in_stack_fffffffffffffa78 = in_stack_00000010;
        in_stack_fffffffffffffa80 = in_stack_00000018;
        local_54 = CLIntercept::NDRangeBuiltinKernel
                             (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                              (cl_kernel)in_stack_fffffffffffffb40.__d.__r,
                              (cl_uint)((ulong)in_stack_fffffffffffffb38.__d.__r >> 0x20),
                              (size_t *)in_stack_fffffffffffffb30.__d.__r,
                              (size_t *)in_stack_fffffffffffffb28.__d.__r,in_stack_fffffffffffffb60,
                              in_stack_fffffffffffffb68,(cl_event *)in_stack_fffffffffffffb70,
                              (cl_event *)in_stack_fffffffffffffb78);
      }
      if (local_54 != 0) {
        pcVar3 = CLIntercept::dispatch(local_50);
        in_stack_fffffffffffffa70 = in_stack_00000010;
        in_stack_fffffffffffffa78 = in_stack_00000018;
        local_54 = (*pcVar3->clEnqueueNDRangeKernel)
                             ((cl_command_queue)in_RDI,in_RSI,in_EDX,(size_t *)in_RCX,
                              (size_t *)in_R8,(size_t *)in_R9,in_stack_00000008,
                              (cl_event *)in_stack_00000010,(cl_event *)in_stack_00000018);
      }
      pSVar4 = CLIntercept::config(local_50);
      if (((pSVar4->HostPerformanceTiming & 1U) != 0) ||
         (in_stack_fffffffffffffbc0 = CLIntercept::config(local_50),
         (in_stack_fffffffffffffbc0->ChromeCallLogging & 1U) != 0)) {
        std::chrono::_V2::steady_clock::now();
        pSVar4 = CLIntercept::config(local_50);
        uStack_172 = extraout_var;
        if (((pSVar4->HostPerformanceTiming & 1U) != 0) &&
           (in_stack_fffffffffffffbb7 =
                 CLIntercept::checkHostPerformanceTimingEnqueueLimits(local_50,(uint64_t)local_60),
           (bool)in_stack_fffffffffffffbb7)) {
          psVar11 = in_stack_fffffffffffffe90;
          CLIntercept::updateHostTimingStats
                    ((CLIntercept *)in_stack_fffffffffffffb30.__d.__r,
                     (char *)in_stack_fffffffffffffb28.__d.__r,(string *)in_stack_fffffffffffffb20,
                     in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
          in_stack_fffffffffffffe70 = in_stack_fffffffffffffe90;
          in_stack_fffffffffffffe90 = psVar11;
        }
      }
      pCVar5 = (CLIntercept *)CLIntercept::config(local_50);
      if (((((((ulong)(pCVar5->m_Dispatch).clCreateContextFromType & 0x10000) != 0) ||
            (in_stack_fffffffffffffba0 = CLIntercept::config(local_50),
            (in_stack_fffffffffffffba0->ITTPerformanceTiming & 1U) != 0)) ||
           (in_stack_fffffffffffffb98 = CLIntercept::config(local_50),
           (in_stack_fffffffffffffb98->ChromePerformanceTiming & 1U) != 0)) ||
          (in_stack_fffffffffffffb90 = CLIntercept::config(local_50),
          (in_stack_fffffffffffffb90->DevicePerfCounterEventBasedSampling & 1U) != 0)) &&
         (in_stack_00000018 != (CLIntercept *)0x0)) {
        bVar2 = CLIntercept::checkDevicePerformanceTimingEnqueueLimits(local_50,(uint64_t)local_60);
        if (bVar2) {
          queuedTime_00.__d.__r._7_1_ = in_stack_fffffffffffffbb7;
          queuedTime_00.__d.__r._0_7_ = in_stack_fffffffffffffbb0;
          in_stack_fffffffffffffe60 = (CLIntercept *)local_158._8_8_;
          CLIntercept::addTimingEvent
                    (pCVar5,&in_stack_fffffffffffffba0->SuppressLogging,
                     (uint64_t)in_stack_fffffffffffffb98,queuedTime_00,
                     (string *)in_stack_fffffffffffffb90,
                     (cl_command_queue)CONCAT17(bVar2,in_stack_fffffffffffffb88),
                     (cl_event)in_stack_fffffffffffffbc0);
        }
        if (bVar1) {
          in_stack_fffffffffffffb80 = (CLIntercept *)CLIntercept::dispatch(local_50);
          (*(in_stack_fffffffffffffb80->m_Dispatch).clReleaseKernel)
                    ((cl_event)in_stack_00000018->m_ProcessId);
          in_stack_00000018 = (CLIntercept *)0x0;
        }
      }
      in_stack_fffffffffffffb78 = CLIntercept::config(local_50);
      if (((((in_stack_fffffffffffffb78->ErrorLogging & 1U) != 0) ||
           (in_stack_fffffffffffffb70 = CLIntercept::config(local_50),
           (in_stack_fffffffffffffb70->ErrorAssert & 1U) != 0)) ||
          (pSVar4 = CLIntercept::config(local_50), (pSVar4->NoErrors & 1U) != 0)) && (local_54 != 0)
         ) {
        pSVar4 = CLIntercept::config(local_50);
        if ((pSVar4->ErrorLogging & 1U) != 0) {
          CLIntercept::logError(in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,cVar9);
        }
        pSVar4 = CLIntercept::config(local_50);
        if ((pSVar4->ErrorAssert & 1U) != 0) {
          raise(5);
        }
        pSVar4 = CLIntercept::config(local_50);
        if ((pSVar4->NoErrors & 1U) != 0) {
          local_54 = 0;
        }
      }
      pSVar4 = CLIntercept::config(local_50);
      if ((pSVar4->LeakChecking & 1U) != 0) {
        in_stack_fffffffffffffb40.__d.__r = (duration)CLIntercept::objectTracker(local_50);
        if (in_stack_00000018 == (CLIntercept *)0x0) {
          in_stack_fffffffffffffb38.__d.__r = (duration)0;
        }
        else {
          in_stack_fffffffffffffb38.__d.__r = (duration)in_stack_00000018->m_ProcessId;
        }
        CObjectTracker::AddAllocation<_cl_event*>
                  (in_stack_fffffffffffffa88,(_cl_event *)in_stack_fffffffffffffa80);
      }
      in_stack_fffffffffffffb30.__d.__r = (duration)CLIntercept::config(local_50);
      if ((((SConfig *)in_stack_fffffffffffffb30.__d.__r)->CallLogging & 1U) != 0) {
        CLIntercept::callLoggingExit
                  (in_stack_fffffffffffffb00,
                   (char *)CONCAT17(in_stack_fffffffffffffaff,in_stack_fffffffffffffaf8),numEvents,
                   in_stack_fffffffffffffae8,
                   (cl_sync_point_khr *)
                   CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
      }
      in_stack_fffffffffffffb28.__d.__r = (duration)CLIntercept::config(local_50);
      if ((*(byte *)((long)in_stack_fffffffffffffb28.__d.__r + 0x19) & 1) != 0) {
        uVar10 = uStack_172;
        CLIntercept::chromeCallLoggingExit
                  (in_stack_fffffffffffffb20,&in_stack_fffffffffffffb18->SuppressLogging,
                   (string *)in_stack_fffffffffffffb10,(bool)includeId,
                   (uint64_t)in_stack_fffffffffffffb00,in_stack_fffffffffffffb30,
                   in_stack_fffffffffffffb28);
        in_stack_fffffffffffffe58 = in_stack_fffffffffffffe90;
      }
      if (in_stack_00000018 == (CLIntercept *)0x0) {
        in_stack_fffffffffffffb20 = (CLIntercept *)0x0;
      }
      else {
        in_stack_fffffffffffffb20 = (CLIntercept *)in_stack_00000018->m_ProcessId;
      }
      if ((in_stack_fffffffffffffb20 != (CLIntercept *)0x0) &&
         ((in_stack_fffffffffffffb18 = CLIntercept::config(local_50),
          (in_stack_fffffffffffffb18->ChromeCallLogging & 1U) != 0 ||
          (in_stack_fffffffffffffb10 = CLIntercept::config(local_50),
          (in_stack_fffffffffffffb10->ChromePerformanceTiming & 1U) != 0)))) {
        if (in_stack_00000018 == (CLIntercept *)0x0) {
          in_stack_fffffffffffffb00 = (CLIntercept *)0x0;
        }
        else {
          in_stack_fffffffffffffb00 = (CLIntercept *)in_stack_00000018->m_ProcessId;
        }
        pCVar5 = local_50;
        CLIntercept::addEvent
                  (in_stack_fffffffffffffaa0,(cl_event)in_stack_fffffffffffffa98,
                   in_stack_fffffffffffffa90);
        includeId = (undefined1)((ulong)pCVar5 >> 0x38);
      }
      std::__cxx11::string::~string((string *)local_148);
      std::__cxx11::string::~string((string *)local_128);
      std::__cxx11::string::~string(local_e8);
    }
    cVar9 = (cl_int)((ulong)in_stack_fffffffffffffc88 >> 0x20);
    pSVar4 = CLIntercept::config(local_50);
    uVar8 = false;
    if ((pSVar4->DumpBuffersAfterEnqueue & 1U) != 0) {
      bVar1 = CLIntercept::checkDumpBufferEnqueueLimits(local_50,(uint64_t)local_60);
      uVar8 = false;
      if (bVar1) {
        uVar8 = CLIntercept::checkDumpBuffersForKernel
                          (in_stack_fffffffffffffa80,(cl_kernel)in_stack_fffffffffffffa78);
      }
    }
    if (((local_61 & 1U) != 0) || ((bool)uVar8 != false)) {
      paVar7 = &local_1d9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d8,"Post",paVar7);
      CLIntercept::dumpBuffersForKernel
                (unaff_retaddr,(string *)unaff_R14,SUB21((ushort)uVar12 >> 8,0),SUB21(uVar12,0),
                 CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),(cl_kernel)in_RDI,
                 (cl_command_queue)in_stack_00000010);
      std::__cxx11::string::~string(local_1d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
    }
    pSVar4 = CLIntercept::config(local_50);
    bVar1 = false;
    if ((pSVar4->DumpImagesAfterEnqueue & 1U) != 0) {
      bVar2 = CLIntercept::checkDumpImageEnqueueLimits(local_50,(uint64_t)local_60);
      bVar1 = false;
      if (bVar2) {
        bVar1 = CLIntercept::checkDumpImagesForKernel
                          (in_stack_fffffffffffffa80,(cl_kernel)in_stack_fffffffffffffa78);
      }
    }
    if (((local_61 & 1U) != 0) || (bVar1 != false)) {
      paVar7 = (allocator *)&stack0xfffffffffffffdff;
      in_stack_fffffffffffffad0 = local_50;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&stack0xfffffffffffffe00,"Post",paVar7);
      CLIntercept::dumpImagesForKernel
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,SUB21((ushort)uVar10 >> 8,0),
                 SUB21(uVar10,0),CONCAT17(uVar8,in_stack_fffffffffffffe48),in_stack_fffffffffffffe40
                 ,(cl_command_queue)in_stack_fffffffffffffe70);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe00);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdff);
    }
    pSVar4 = CLIntercept::config(local_50);
    if ((pSVar4->FinishAfterEnqueue & 1U) == 0) {
      pSVar4 = CLIntercept::config(local_50);
      if ((pSVar4->FlushAfterEnqueue & 1U) != 0) {
        pcVar3 = CLIntercept::dispatch(local_50);
        (*pcVar3->clFlush)((cl_command_queue)in_RDI);
      }
    }
    else {
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffa70);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffa70);
      pSVar4 = CLIntercept::config(local_50);
      if (((pSVar4->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar4 = CLIntercept::config(local_50), (pSVar4->HostPerformanceTiming & 1U) != 0 ||
          (pSVar4 = CLIntercept::config(local_50), (pSVar4->ChromeCallLogging & 1U) != 0)))) {
        local_220 = (cl_kernel)std::chrono::_V2::steady_clock::now();
        in_stack_fffffffffffffdf0 = local_220;
      }
      CLIntercept::logFlushOrFinishAfterEnqueueStart
                (in_stack_fffffffffffffb80,&in_stack_fffffffffffffb78->SuppressLogging,
                 &in_stack_fffffffffffffb70->SuppressLogging);
      pcVar3 = CLIntercept::dispatch(local_50);
      local_224 = (*pcVar3->clFinish)((cl_command_queue)in_RDI);
      CLIntercept::logFlushOrFinishAfterEnqueueEnd
                (in_stack_fffffffffffffca0,&in_stack_fffffffffffffc98->SuppressLogging,
                 (char *)in_stack_fffffffffffffc90,cVar9);
      pSVar4 = CLIntercept::config(local_50);
      if (((pSVar4->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar4 = CLIntercept::config(local_50), (pSVar4->HostPerformanceTiming & 1U) != 0 ||
          (pSVar4 = CLIntercept::config(local_50), (pSVar4->ChromeCallLogging & 1U) != 0)))) {
        local_230 = std::chrono::_V2::steady_clock::now();
        local_218 = local_230;
        pSVar4 = CLIntercept::config(local_50);
        if (((pSVar4->HostPerformanceTiming & 1U) != 0) &&
           (bVar1 = CLIntercept::checkHostPerformanceTimingEnqueueLimits
                              (local_50,(uint64_t)local_60), bVar1)) {
          in_stack_fffffffffffffac8 = &local_251;
          std::allocator<char>::allocator();
          local_260 = in_stack_fffffffffffffdf0;
          std::__cxx11::string::string(local_250,"",in_stack_fffffffffffffac8);
          local_268 = local_218;
          CLIntercept::updateHostTimingStats
                    ((CLIntercept *)in_stack_fffffffffffffb30.__d.__r,
                     (char *)in_stack_fffffffffffffb28.__d.__r,(string *)in_stack_fffffffffffffb20,
                     in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
          std::__cxx11::string::~string(local_250);
          std::allocator<char>::~allocator((allocator<char> *)&local_251);
        }
        pSVar4 = CLIntercept::config(local_50);
        if ((pSVar4->ChromeCallLogging & 1U) != 0) {
          paVar7 = &local_289;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_288,"",paVar7);
          CLIntercept::chromeCallLoggingExit
                    (in_stack_fffffffffffffb20,&in_stack_fffffffffffffb18->SuppressLogging,
                     (string *)in_stack_fffffffffffffb10,(bool)includeId,
                     (uint64_t)in_stack_fffffffffffffb00,in_stack_fffffffffffffb30,
                     in_stack_fffffffffffffb28);
          std::__cxx11::string::~string(local_288);
          std::allocator<char>::~allocator((allocator<char> *)&local_289);
        }
      }
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffa70);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffa70);
      pSVar4 = CLIntercept::config(local_50);
      if (((pSVar4->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar4 = CLIntercept::config(local_50), (pSVar4->HostPerformanceTiming & 1U) != 0 ||
          (pSVar4 = CLIntercept::config(local_50), (pSVar4->ChromeCallLogging & 1U) != 0)))) {
        in_stack_fffffffffffffd58 = std::chrono::_V2::steady_clock::now();
      }
      CLIntercept::checkTimingEvents(unaff_R14);
      pSVar4 = CLIntercept::config(local_50);
      if (((pSVar4->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar4 = CLIntercept::config(local_50), (pSVar4->HostPerformanceTiming & 1U) != 0 ||
          (pSVar4 = CLIntercept::config(local_50), (pSVar4->ChromeCallLogging & 1U) != 0)))) {
        uVar6 = std::chrono::_V2::steady_clock::now();
        pSVar4 = CLIntercept::config(local_50);
        if (((pSVar4->HostPerformanceTiming & 1U) != 0) &&
           (bVar1 = CLIntercept::checkHostPerformanceTimingEnqueueLimits
                              (local_50,(uint64_t)local_60), bVar1)) {
          paVar7 = &local_2e1;
          std::allocator<char>::allocator();
          local_2f8 = uVar6;
          local_2f0 = in_stack_fffffffffffffd58;
          std::__cxx11::string::string(local_2e0,"",paVar7);
          uVar6 = local_2f8;
          in_stack_fffffffffffffd58 = local_2f0;
          CLIntercept::updateHostTimingStats
                    ((CLIntercept *)in_stack_fffffffffffffb30.__d.__r,
                     (char *)in_stack_fffffffffffffb28.__d.__r,(string *)in_stack_fffffffffffffb20,
                     in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
          std::__cxx11::string::~string(local_2e0);
          std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
        }
        pSVar4 = CLIntercept::config(local_50);
        if ((pSVar4->ChromeCallLogging & 1U) != 0) {
          paVar7 = &local_319;
          std::allocator<char>::allocator();
          local_330 = uVar6;
          local_328 = in_stack_fffffffffffffd58;
          std::__cxx11::string::string(local_318,"",paVar7);
          CLIntercept::chromeCallLoggingExit
                    (in_stack_fffffffffffffb20,&in_stack_fffffffffffffb18->SuppressLogging,
                     (string *)in_stack_fffffffffffffb10,(bool)includeId,
                     (uint64_t)in_stack_fffffffffffffb00,in_stack_fffffffffffffb30,
                     in_stack_fffffffffffffb28);
          std::__cxx11::string::~string(local_318);
          std::allocator<char>::~allocator((allocator<char> *)&local_319);
        }
      }
    }
    pSVar4 = CLIntercept::config(local_50);
    if (((pSVar4->AubCapture & 1U) != 0) &&
       ((pSVar4 = CLIntercept::config(local_50), (pSVar4->AubCaptureIndividualEnqueues & 1U) != 0 ||
        (bVar1 = CLIntercept::checkAubCaptureEnqueueLimits(local_50,(uint64_t)local_60), !bVar1))))
    {
      CLIntercept::stopAubCapture
                (in_stack_fffffffffffffad0,(cl_command_queue)in_stack_fffffffffffffac8);
    }
  }
  return local_54;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL CLIRN(clEnqueueNDRangeKernel)(
    cl_command_queue command_queue,
    cl_kernel kernel,
    cl_uint work_dim,
    const size_t* global_work_offset,
    const size_t* global_work_size,
    const size_t* local_work_size,
    cl_uint num_events_in_wait_list,
    const cl_event* event_wait_list,
    cl_event* event )
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->dispatch().clEnqueueNDRangeKernel )
    {
        cl_int  retVal = CL_SUCCESS;

        INCREMENT_ENQUEUE_COUNTER();
        CHECK_CAPTURE_REPLAY_START_KERNEL(
            kernel,
            work_dim,
            global_work_offset,
            global_work_size,
            local_work_size );
        DUMP_BUFFERS_BEFORE_ENQUEUE( kernel, command_queue );
        DUMP_IMAGES_BEFORE_ENQUEUE( kernel, command_queue );
        INJECT_MEMORY_OBJECTS( kernel, command_queue );
        CHECK_AUBCAPTURE_START_KERNEL(
            kernel,
            work_dim,
            global_work_size,
            local_work_size,
            command_queue );

        if( pIntercept->config().NullEnqueue == false )
        {
            if( pIntercept->config().NullLocalWorkSize )
            {
                local_work_size = NULL;
            }
            pIntercept->overrideNullLocalWorkSize(
                work_dim,
                global_work_size,
                local_work_size );

            std::string argsString;
            if( pIntercept->config().CallLogging )
            {
                pIntercept->getEnqueueNDRangeKernelArgsString(
                    work_dim,
                    global_work_offset,
                    global_work_size,
                    local_work_size,
                    argsString );
                argsString += getFormattedEventWaitList(
                    pIntercept,
                    num_events_in_wait_list,
                    event_wait_list);
            }
            CALL_LOGGING_ENTER_KERNEL(
                kernel,
                "queue = %p, kernel = %p, %s",
                command_queue,
                kernel,
                argsString.c_str() );

            CHECK_EVENT_LIST( num_events_in_wait_list, event_wait_list, event );
            GET_TIMING_TAGS_KERNEL(
                command_queue,
                kernel,
                work_dim,
                global_work_offset,
                global_work_size,
                local_work_size );
            DEVICE_PERFORMANCE_TIMING_START( event );
            HOST_PERFORMANCE_TIMING_START();

//            ITT_ADD_PARAM_AS_METADATA(command_queue);
//            ITT_ADD_PARAM_AS_METADATA(kernel);
            ITT_ADD_PARAM_AS_METADATA(work_dim);
            ITT_ADD_ARRAY_PARAM_AS_METADATA(work_dim, global_work_offset);
            ITT_ADD_ARRAY_PARAM_AS_METADATA(work_dim, global_work_size);
            ITT_ADD_ARRAY_PARAM_AS_METADATA(work_dim, local_work_size);
            ITT_ADD_ARRAY_PARAM_AS_METADATA(num_events_in_wait_list, event_wait_list);

            if( pIntercept->config().Emulate_cl_intel_unified_shared_memory )
            {
                pIntercept->setUSMKernelExecInfo(
                    command_queue,
                    kernel );
            }

            retVal = CL_INVALID_OPERATION;

            if( ( retVal != CL_SUCCESS ) &&
                pIntercept->config().OverrideBuiltinKernels )
            {

                retVal = pIntercept->NDRangeBuiltinKernel(
                    command_queue,
                    kernel,
                    work_dim,
                    global_work_offset,
                    global_work_size,
                    local_work_size,
                    num_events_in_wait_list,
                    event_wait_list,
                    event );
            }

            if( retVal != CL_SUCCESS )
            {
                retVal = pIntercept->dispatch().clEnqueueNDRangeKernel(
                    command_queue,
                    kernel,
                    work_dim,
                    global_work_offset,
                    global_work_size,
                    local_work_size,
                    num_events_in_wait_list,
                    event_wait_list,
                    event );
            }

            HOST_PERFORMANCE_TIMING_END_WITH_TAG();
            DEVICE_PERFORMANCE_TIMING_END_WITH_TAG( command_queue, event );
            CHECK_ERROR( retVal );
            ADD_OBJECT_ALLOCATION( event ? event[0] : NULL );
            CALL_LOGGING_EXIT_EVENT_WITH_TAG( retVal, event );
            ADD_EVENT( event ? event[0] : NULL );
        }

        DUMP_BUFFERS_AFTER_ENQUEUE( kernel, command_queue );
        DUMP_IMAGES_AFTER_ENQUEUE( kernel, command_queue );
        FINISH_OR_FLUSH_AFTER_ENQUEUE( command_queue );
        CHECK_AUBCAPTURE_STOP( command_queue );

        return retVal;
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_QUEUE);
}